

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindImageTexturesTest::iterate(ErrorsBindImageTexturesTest *this)

{
  ostringstream *poVar1;
  GLboolean GVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  long lVar6;
  GLsizei GVar7;
  GLsizei GVar8;
  GLuint GVar9;
  Texture t_texture;
  GLuint t_texture_ids [4];
  GLint max_textures;
  GLuint texture_ids [4];
  Enum<int,_2UL> local_208;
  Texture texture [4];
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  max_textures = 0;
  (*gl->getIntegerv)(0x8f38,&max_textures);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x82a);
  iVar3 = 3;
  if (max_textures < 4) {
    iVar3 = max_textures + -1;
  }
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&texture[0].m_id + lVar6) = 0xffffffff;
    *(undefined8 *)((long)&texture[0].m_context + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  GVar7 = 4;
  if (max_textures < 4) {
    GVar7 = max_textures;
  }
  MultiBind::Texture::InitStorage
            (texture,(this->super_TestCase).m_context,0xde1,1,0x8058,8,8,8,false);
  MultiBind::Texture::InitStorage
            (texture + 1,(this->super_TestCase).m_context,0x8c1a,1,0x8058,8,8,8,false);
  MultiBind::Texture::InitStorage
            (texture + 2,(this->super_TestCase).m_context,0x8c18,1,0x8058,8,8,8,false);
  MultiBind::Texture::InitStorage
            (texture + 3,(this->super_TestCase).m_context,0x806f,1,0x8058,8,8,8,false);
  texture_ids[0] = texture[0].m_id;
  texture_ids[1] = texture[1].m_id;
  texture_ids[2] = texture[2].m_id;
  texture_ids[3] = texture[3].m_id;
  GVar9 = 0;
  if (3 < max_textures) {
    GVar9 = max_textures - 3;
  }
  GVar8 = 4;
  if (max_textures < 4) {
    GVar8 = max_textures + 1;
  }
  (*gl->bindImageTextures)(GVar9,GVar8,texture_ids);
  t_texture_ids[2] = (*gl->getError)();
  if (t_texture_ids[2] != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x856);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    t_texture_ids._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_texture_ids,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    t_texture._0_8_ = glu::getErrorName;
    t_texture.m_context = (Context *)CONCAT44(t_texture.m_context._4_4_,0x502);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&t_texture,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"BindImageTextures with invalid <first> + <count>",0x30);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x856);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  t_texture_ids[1] = texture_ids[1];
  t_texture_ids[0] = texture_ids[0];
  t_texture_ids[3] = texture_ids[3];
  t_texture_ids[2] = texture_ids[2];
  GVar9 = 1;
  while( true ) {
    GVar2 = (*gl->isTexture)(GVar9);
    if (GVar2 != '\x01') break;
    GVar9 = GVar9 + 1;
  }
  t_texture_ids[iVar3] = GVar9;
  (*gl->bindImageTextures)(0,GVar7,t_texture_ids);
  GVar4 = (*gl->getError)();
  if (GVar4 != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x871);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    t_texture._0_8_ = glu::getErrorName;
    t_texture.m_context = (Context *)CONCAT44(t_texture.m_context._4_4_,GVar4);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&t_texture,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    local_208.m_getName = glu::getErrorName;
    local_208.m_value = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"BindImageTextures with invalid texture id",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x871);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  t_texture_ids[1] = texture_ids[1];
  t_texture_ids[0] = texture_ids[0];
  t_texture_ids[3] = texture_ids[3];
  t_texture_ids[2] = texture_ids[2];
  t_texture.m_id = 0xffffffff;
  t_texture.m_context = (this->super_TestCase).m_context;
  MultiBind::Texture::Generate(gl,&t_texture.m_id);
  (*gl->bindTexture)(0xde1,t_texture.m_id);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x415);
  (*gl->texStorage2D)(0xde1,1,0x8c3d,8,0);
  local_208.m_value = (*gl->getError)();
  if (local_208.m_value != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x882);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    local_208.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"texStorage2D has height set to 0",0x20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x882);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  t_texture_ids[iVar3] = t_texture.m_id;
  (*gl->bindImageTextures)(0,GVar7,t_texture_ids);
  local_208.m_value = (*gl->getError)();
  if (local_208.m_value == 0x502) {
    MultiBind::Texture::~Texture(&t_texture);
    t_texture_ids[1] = texture_ids[1];
    t_texture_ids[0] = texture_ids[0];
    t_texture_ids[3] = texture_ids[3];
    t_texture_ids[2] = texture_ids[2];
    t_texture.m_id = 0xffffffff;
    t_texture.m_context = (Context *)0x0;
    MultiBind::Texture::InitStorage
              (&t_texture,(this->super_TestCase).m_context,0xde1,1,0x8c3d,8,0,8,true);
    t_texture_ids[iVar3] = t_texture.m_id;
    (*gl->bindImageTextures)(0,GVar7,t_texture_ids);
    local_208.m_value = (*gl->getError)();
    if (local_208.m_value == 0x501) {
      MultiBind::Texture::~Texture(&t_texture);
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      lVar6 = 0x30;
      do {
        MultiBind::Texture::~Texture((Texture *)((long)&texture[0].m_id + lVar6));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != -0x10);
      return STOP;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x89d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    local_208.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"BindImageTextures with 2D texture that has height set to 0",0x3a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x89d);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
  std::ostream::operator<<(poVar1,0x889);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13);
  local_208.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
  local_1b8.m_getName = glu::getErrorName;
  local_1b8.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"BindImageTextures with invalid internal format",0x2e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x889);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindImageTexturesTest::iterate()
{
	static const GLuint  depth		= 8;
	static const GLuint  height		= 8;
	static const GLsizei n_textures = 4;
	static const GLuint  width		= 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLsizei count			= n_textures;
	GLuint  first			= 0;
	GLuint  invalid_id		= 1; /* Start with 1, as 0 is not valid name */
	GLint   max_textures	= 0;
	size_t  validated_index = n_textures - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_textures > max_textures)
	{
		count			= max_textures;
		validated_index = max_textures - 1;
	}

	/* Storage */
	Texture texture[n_textures];
	GLuint  texture_ids[n_textures];

	/* Prepare textures */
	texture[0].InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGBA8, width, height, depth);
	texture[1].InitStorage(m_context, GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, width, height, depth);
	texture[2].InitStorage(m_context, GL_TEXTURE_1D_ARRAY, 1, GL_RGBA8, width, height, depth);
	texture[3].InitStorage(m_context, GL_TEXTURE_3D, 1, GL_RGBA8, width, height, depth);

	for (size_t i = 0; i < n_textures; ++i)
	{
		texture_ids[i] = texture[i].m_id;
	}

	/* - INVALID_OPERATION when <first> + <count> exceed limits; */
	{
		GLsizei t_count = n_textures;
		GLuint  t_first = 0;

		/* Select first so <first + count> exceeds max, avoid negative first */
		if (n_textures <= max_textures)
		{
			t_first = max_textures - n_textures + 1;
		}
		else
		{
			t_count = max_textures + 1;
			/* first = 0; */
		}

		/* Test */
		gl.bindImageTextures(t_first, t_count, texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid <first> + <count>");
	}

	/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
	 * existing buffer;
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isTexture(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		/* Invalidate the entry */
		t_texture_ids[validated_index] = invalid_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid texture id");
	}

	/* - INVALID_OPERATION if any entry found in <textures> has invalid internal
	 * format at level 0;
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Prepare texture with invalid format */
		Texture t_texture;
		t_texture.Init(m_context);
		t_texture.Generate(gl, t_texture.m_id);
		t_texture.Bind(gl, t_texture.m_id, GL_TEXTURE_2D);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGB9_E5, width, 0);
		CHECK_ERROR(GL_INVALID_VALUE, "texStorage2D has height set to 0");

		/* Invalidate the entry */
		t_texture_ids[validated_index] = t_texture.m_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid internal format");
	}

	/* - INVALID_VALUE when any entry in <textures> has any of dimensions equal
	 * to 0 at level 0.
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Prepare texture with invalid format */
		Texture t_texture;
		t_texture.InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGB9_E5, width, 0, depth, true);

		/* Invalidate the entry */
		t_texture_ids[validated_index] = t_texture.m_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_VALUE, "BindImageTextures with 2D texture that has height set to 0");
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}